

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_info_impl.hpp
# Opt level: O0

string * toml::format_error(string *errkind,error_info *err)

{
  reference this;
  bool bVar1;
  ostream *poVar2;
  void *pvVar3;
  error_info *in_RDX;
  string *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *m;
  source_location *l;
  string *in_stack_000000b0;
  source_location *in_stack_000000b8;
  string *in_stack_000000c0;
  size_t in_stack_000000c8;
  ostringstream oss;
  pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *lm;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1;
  string prev_fname;
  bool first;
  size_t lnw;
  string *errmsg;
  undefined7 in_stack_fffffffffffffcf8;
  char in_stack_fffffffffffffcff;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd10;
  anon_class_8_1_ba1d44c5 *in_stack_fffffffffffffd20;
  void *in_stack_fffffffffffffd30;
  char c;
  ostream *in_stack_fffffffffffffd38;
  string local_240 [32];
  string local_220 [32];
  ostringstream local_200 [376];
  reference local_88;
  pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_80;
  __normal_iterator<const_std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_78;
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_70;
  byte local_41;
  error_info *local_40;
  size_t local_38;
  byte local_19;
  error_info *local_18;
  
  local_19 = 0;
  local_18 = in_RDX;
  std::__cxx11::string::string(in_stack_fffffffffffffd10);
  bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x24c006);
  if (!bVar1) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffd00,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8));
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffd00,in_stack_fffffffffffffcff);
  }
  error_info::title_abi_cxx11_(local_18);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd00,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8));
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd00,in_stack_fffffffffffffcff);
  local_40 = local_18;
  local_38 = format_error::anon_class_8_1_ba1d44c5::operator()(in_stack_fffffffffffffd20);
  local_41 = 1;
  std::__cxx11::string::string(in_stack_fffffffffffffd10);
  local_70 = error_info::locations_abi_cxx11_(local_18);
  local_78._M_current =
       (pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)std::
          vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::begin((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8));
  local_80 = (pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)std::
                vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::end((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8));
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      ((__normal_iterator<const_std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)in_stack_fffffffffffffd00,
                       (__normal_iterator<const_std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8));
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    local_88 = __gnu_cxx::
               __normal_iterator<const_std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator*(&local_78);
    c = (char)((ulong)in_stack_fffffffffffffd30 >> 0x38);
    if ((local_41 & 1) == 0) {
      std::__cxx11::ostringstream::ostringstream(local_200);
      detail::make_string_abi_cxx11_((size_t)in_stack_fffffffffffffd38,c);
      poVar2 = std::operator<<((ostream *)local_200,local_220);
      pvVar3 = (void *)std::ostream::operator<<(poVar2,color::ansi::bold);
      poVar2 = (ostream *)std::ostream::operator<<(pvVar3,color::ansi::blue);
      in_stack_fffffffffffffd38 = std::operator<<(poVar2," |");
      in_stack_fffffffffffffd30 =
           (void *)std::ostream::operator<<(in_stack_fffffffffffffd38,color::ansi::reset);
      poVar2 = (ostream *)std::ostream::operator<<(in_stack_fffffffffffffd30,color::ansi::bold);
      poVar2 = std::operator<<(poVar2," ...\n");
      std::ostream::operator<<(poVar2,color::ansi::reset);
      std::__cxx11::string::~string(in_stack_fffffffffffffd00);
      detail::make_string_abi_cxx11_
                ((size_t)in_stack_fffffffffffffd38,(char)((ulong)in_stack_fffffffffffffd30 >> 0x38))
      ;
      poVar2 = std::operator<<((ostream *)local_200,local_240);
      pvVar3 = (void *)std::ostream::operator<<(poVar2,color::ansi::bold);
      poVar2 = (ostream *)std::ostream::operator<<(pvVar3,color::ansi::blue);
      in_stack_fffffffffffffd00 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::operator<<(poVar2," |\n");
      std::ostream::operator<<(in_stack_fffffffffffffd00,color::ansi::reset);
      std::__cxx11::string::~string(in_stack_fffffffffffffd00);
      std::__cxx11::ostringstream::str();
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffd00,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8));
      std::__cxx11::string::~string(in_stack_fffffffffffffd00);
      std::__cxx11::ostringstream::~ostringstream(local_200);
    }
    this = local_88;
    detail::format_location_impl
              (in_stack_000000c8,in_stack_000000c0,in_stack_000000b8,in_stack_000000b0);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffd00,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8));
    std::__cxx11::string::~string(in_stack_fffffffffffffd00);
    source_location::file_name_abi_cxx11_(&this->first);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffd00,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8));
    local_41 = 0;
    __gnu_cxx::
    __normal_iterator<const_std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::operator++(&local_78);
  }
  error_info::suffix_abi_cxx11_(local_18);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd00,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8));
  local_19 = 1;
  std::__cxx11::string::~string(in_stack_fffffffffffffd00);
  if ((local_19 & 1) == 0) {
    std::__cxx11::string::~string(in_stack_fffffffffffffd00);
  }
  return in_RDI;
}

Assistant:

TOML11_INLINE std::string format_error(const std::string& errkind, const error_info& err)
{
    std::string errmsg;
    if( ! errkind.empty())
    {
        errmsg = errkind;
        errmsg += ' ';
    }
    errmsg += err.title();
    errmsg += '\n';

    const auto lnw = [&err]() {
        std::size_t width = 0;
        for(const auto& l : err.locations())
        {
            width = (std::max)(detail::integer_width_base10(l.first.last_line_number()), width);
        }
        return width;
    }();

    bool first = true;
    std::string prev_fname;
    for(const auto& lm : err.locations())
    {
        if( ! first)
        {
            std::ostringstream oss;
            oss << detail::make_string(lnw + 1, ' ')
                << color::bold << color::blue << " |" << color::reset
                << color::bold << " ...\n" << color::reset;
            oss << detail::make_string(lnw + 1, ' ')
                << color::bold << color::blue << " |\n" << color::reset;
            errmsg += oss.str();
        }

        const auto& l = lm.first;
        const auto& m = lm.second;

        errmsg += detail::format_location_impl(lnw, prev_fname, l, m);

        prev_fname = l.file_name();
        first = false;
    }

    errmsg += err.suffix();

    return errmsg;
}